

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_cmpa(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 src;
  TCGv_i32 *ppTVar2;
  uint uVar3;
  
  pTVar1 = s->uc->tcg_ctx;
  src = gen_ea(env,s,insn,((insn >> 8 & 1) != 0) + 1,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
               (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (src != pTVar1->NULL_QREG) {
    uVar3 = insn >> 9 & 7;
    if (((uint)s->writeback_mask >> uVar3 & 1) == 0) {
      ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar2 = s->writeback;
    }
    gen_update_cc_cmp(s,ppTVar2[uVar3],src,2);
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(cmpa)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv src;
    TCGv reg;

    if (insn & 0x100) {
        opsize = OS_LONG;
    } else {
        opsize = OS_WORD;
    }
    SRC_EA(env, src, opsize, 1, NULL);
    reg = AREG(insn, 9);
    gen_update_cc_cmp(s, reg, src, OS_LONG);
}